

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O0

int av1_get_qindex(segmentation *seg,int segment_id,int base_qindex)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  segmentation *in_RDI;
  int seg_qindex;
  int data;
  int local_4;
  
  iVar1 = segfeature_active(in_RDI,(uint8_t)in_ESI,'\0');
  local_4 = in_EDX;
  if (iVar1 != 0) {
    iVar1 = get_segdata(in_RDI,in_ESI,'\0');
    local_4 = clamp(in_EDX + iVar1,0,0xff);
  }
  return local_4;
}

Assistant:

int av1_get_qindex(const struct segmentation *seg, int segment_id,
                   int base_qindex) {
  if (segfeature_active(seg, segment_id, SEG_LVL_ALT_Q)) {
    const int data = get_segdata(seg, segment_id, SEG_LVL_ALT_Q);
    const int seg_qindex = base_qindex + data;
    return clamp(seg_qindex, 0, MAXQ);
  } else {
    return base_qindex;
  }
}